

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O3

bool __thiscall Minisat::Solver::addClause_(Solver *this,vec<Minisat::Lit,_int> *ps)

{
  uint uVar1;
  Lit *pLVar2;
  lbool *plVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  CRef CVar8;
  long lVar9;
  int iVar10;
  long lVar11;
  byte bVar12;
  int iVar13;
  uint uVar14;
  byte bVar15;
  bool bVar16;
  CRef cr;
  CRef local_34;
  
  if (this->ok != true) {
    return false;
  }
  sort<Minisat::Lit,Minisat::LessThan_default<Minisat::Lit>>(ps->data,ps->sz);
  bVar7 = l_False;
  bVar6 = l_True;
  iVar10 = ps->sz;
  if (0 < iVar10) {
    pLVar2 = ps->data;
    plVar3 = (this->assigns).super_IntMap<int,_Minisat::lbool,_Minisat::MkIndexDefault<int>_>.map.
             data;
    bVar4 = l_True & 2;
    bVar5 = l_False & 2;
    lVar11 = 0;
    uVar14 = 0xfffffffe;
    iVar13 = 0;
    do {
      uVar1 = pLVar2[lVar11].x;
      bVar15 = plVar3[(int)uVar1 >> 1].value;
      bVar12 = (byte)uVar1 & 1 ^ bVar15;
      bVar15 = bVar15 & 2;
      if (bVar12 == bVar6 && bVar4 == 0 || (bVar15 & bVar6) != 0) {
        return true;
      }
      if ((uVar1 ^ uVar14) == 1) {
        return true;
      }
      if (((bVar12 != bVar7 || bVar5 != 0) && (bVar15 & bVar7) == 0) && (uVar1 != uVar14)) {
        lVar9 = (long)iVar13;
        iVar13 = iVar13 + 1;
        pLVar2[lVar9].x = uVar1;
        iVar10 = ps->sz;
        uVar14 = uVar1;
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 < iVar10);
    if (0 < (int)lVar11 - iVar13) {
      iVar10 = (iVar10 + iVar13) - (int)lVar11;
      ps->sz = iVar10;
    }
  }
  if (iVar10 == 1) {
    iVar10 = ps->data->x;
    (this->assigns).super_IntMap<int,_Minisat::lbool,_Minisat::MkIndexDefault<int>_>.map.data
    [iVar10 >> 1].value = (byte)iVar10 & 1;
    (this->vardata).super_IntMap<int,_Minisat::Solver::VarData,_Minisat::MkIndexDefault<int>_>.map.
    data[iVar10 >> 1] = (VarData)((ulong)(uint)(this->trail_lim).sz << 0x20 | 0xffffffff);
    iVar13 = (this->trail).sz;
    (this->trail).sz = iVar13 + 1;
    (this->trail).data[iVar13].x = iVar10;
    CVar8 = propagate(this);
    bVar16 = CVar8 == 0xffffffff;
    this->ok = bVar16;
  }
  else if (iVar10 == 0) {
    this->ok = false;
    bVar16 = false;
  }
  else {
    local_34 = ClauseAllocator::alloc(&this->ca,ps,false);
    vec<unsigned_int,_int>::push(&this->clauses,&local_34);
    attachClause(this,local_34);
    bVar16 = true;
  }
  return bVar16;
}

Assistant:

bool Solver::addClause_(vec<Lit>& ps)
{
    assert(decisionLevel() == 0);
    if (!ok) return false;

    // Check if clause is satisfied and remove false/duplicate literals:
    sort(ps);
    Lit p; int i, j;
    for (i = j = 0, p = lit_Undef; i < ps.size(); i++)
        if (value(ps[i]) == l_True || ps[i] == ~p)
            return true;
        else if (value(ps[i]) != l_False && ps[i] != p)
            ps[j++] = p = ps[i];
    ps.shrink(i - j);

    if (ps.size() == 0)
        return ok = false;
    else if (ps.size() == 1){
        uncheckedEnqueue(ps[0]);
        return ok = (propagate() == CRef_Undef);
    }else{
        CRef cr = ca.alloc(ps, false);
        clauses.push(cr);
        attachClause(cr);
    }

    return true;
}